

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

string * __thiscall Context::execute(Context *this,string *input,shared_ptr<Session> *session)

{
  bool bVar1;
  byte bVar2;
  tm *__tp;
  ostream *poVar3;
  ostream *in_RSI;
  string *in_RDI;
  time_t now;
  char timestamp [32];
  char *exception;
  Context *in_stack_00000148;
  string actor;
  Parser parser;
  string *output;
  Parser *in_stack_fffffffffffffd28;
  Parser *in_stack_fffffffffffffd30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd98;
  Parser *in_stack_fffffffffffffdd0;
  Context *in_stack_fffffffffffffdd8;
  string local_210 [32];
  time_t local_1f0;
  char local_1e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe40;
  Session *in_stack_fffffffffffffe48;
  Parser *in_stack_fffffffffffffe60;
  Context *in_stack_fffffffffffffe68;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [8];
  string *in_stack_ffffffffffffff38;
  Parser *in_stack_ffffffffffffff40;
  string local_b0 [143];
  undefined1 local_21;
  
  local_21 = 0;
  std::__cxx11::string::string(in_RDI);
  Parser::Parser(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  Parser::actor_abi_cxx11_(in_stack_fffffffffffffd28);
  bVar1 = Grammar::is_type(&in_stack_fffffffffffffd30->_actor);
  if (bVar1) {
    execute_in_type_abi_cxx11_(in_stack_00000148,(Parser *)exception);
    std::__cxx11::string::operator=(in_RDI,local_d0);
    std::__cxx11::string::~string(local_d0);
  }
  else {
    bVar1 = Grammar::is_context((string *)0x1a68e1);
    if (bVar1) {
      execute_in_context_abi_cxx11_(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      std::__cxx11::string::operator=(in_RDI,local_f0);
      std::__cxx11::string::~string(local_f0);
    }
    else {
      bVar1 = Grammar::is_variable(in_stack_fffffffffffffd98);
      if (bVar1) {
        execute_in_variable_abi_cxx11_(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
        std::__cxx11::string::operator=(in_RDI,local_110);
        std::__cxx11::string::~string(local_110);
      }
      else {
        bVar1 = Grammar::is_connection((string *)0x1a69b3);
        if (bVar1) {
          std::__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1a69d9);
          Parser::message_name_abi_cxx11_(in_stack_fffffffffffffd28);
          Parser::arguments_abi_cxx11_(in_stack_fffffffffffffd28);
          Session::receive(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                           in_stack_fffffffffffffe38);
          std::__cxx11::string::operator=(in_RDI,local_130);
          std::__cxx11::string::~string(local_130);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(in_stack_fffffffffffffd40);
          std::__cxx11::string::~string(local_150);
        }
      }
    }
  }
  std::__cxx11::string::~string(local_b0);
  Parser::~Parser(in_stack_fffffffffffffd30);
  local_1f0 = time((time_t *)0x0);
  __tp = localtime(&local_1f0);
  strftime(local_1e8,0x20,"[%F %T]",__tp);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    if (((byte)in_RSI[0x208] & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,local_1e8);
      poVar3 = std::operator<<(poVar3," ");
      str_utils::trim(in_stack_fffffffffffffd68);
      poVar3 = std::operator<<(poVar3,(string *)&stack0xfffffffffffffdd0);
      poVar3 = std::operator<<(poVar3," -> ");
      poVar3 = std::operator<<(poVar3,in_RDI);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
    }
  }
  else {
    poVar3 = std::operator<<(in_RSI,local_1e8);
    poVar3 = std::operator<<(poVar3," ");
    str_utils::trim(in_stack_fffffffffffffd68);
    poVar3 = std::operator<<(poVar3,local_210);
    poVar3 = std::operator<<(poVar3," -> ");
    poVar3 = std::operator<<(poVar3,in_RDI);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_210);
  }
  return in_RDI;
}

Assistant:

std::string Context::execute(const std::string& input, std::shared_ptr<Session> session) {
    std::string output;
    try {
        Parser parser(input);
        std::string actor = parser.actor();
        if (Grammar::is_type(actor))
            output = execute_in_type(parser);
        else if (Grammar::is_context(actor))
            output = execute_in_context(parser);
        else if (Grammar::is_variable(actor))
            output = execute_in_variable(parser);
        else if (Grammar::is_connection(actor))
            output = session->receive(parser.message_name(), parser.arguments());
    }
    catch (const char* exception) {
        output = std::string(exception);
    }
    catch (...) {
        output = std::string(EXC_UNKNOWN_ERROR);
    }
    char timestamp[32];
    time_t now = time(NULL);
    strftime(timestamp, sizeof(timestamp), "[%F %T]", localtime(&now));
    if (_logfile.is_open())
        _logfile << timestamp << " " << str_utils::trim(input) << " -> " << output << std::endl;
    else if (!_is_quiet_mode)
        std::cout << timestamp << " " << str_utils::trim(input) << " -> " << output << std::endl;
    return output;
}